

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

proficiency_type * __thiscall
CProficiencies::GetProficiency
          (proficiency_type *__return_storage_ptr__,CProficiencies *this,char *profname)

{
  char *pcVar1;
  int iVar2;
  pointer ppVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  pointer ppVar7;
  pointer ppVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  ppVar3 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (profname != (char *)0x0) {
    lVar6 = (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (lVar6 >> 3) * -0x3333333333333333 >> 2;
    ppVar7 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      ppVar7 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_start + 2;
      do {
        ppVar8 = ppVar7;
        if ((ppVar8[-2].name != (char *)0x0) && (bVar4 = str_cmp(ppVar8[-2].name,profname), !bVar4))
        {
          ppVar8 = ppVar8 + -2;
          goto LAB_003711a9;
        }
        if ((ppVar8[-1].name != (char *)0x0) && (bVar4 = str_cmp(ppVar8[-1].name,profname), !bVar4))
        {
          ppVar8 = ppVar8 + -1;
          goto LAB_003711a9;
        }
        if ((ppVar8->name != (char *)0x0) && (bVar4 = str_cmp(ppVar8->name,profname), !bVar4))
        goto LAB_003711a9;
        if ((ppVar8[1].name != (char *)0x0) && (bVar4 = str_cmp(ppVar8[1].name,profname), !bVar4)) {
          ppVar8 = ppVar8 + 1;
          goto LAB_003711a9;
        }
        lVar5 = lVar5 + -1;
        lVar6 = lVar6 + -0xa0;
        ppVar7 = ppVar8 + 4;
      } while (1 < lVar5);
      ppVar7 = ppVar8 + 2;
    }
    lVar5 = (lVar6 >> 3) * -0x3333333333333333;
    if (lVar5 == 1) {
LAB_00371173:
      if ((ppVar7->name == (char *)0x0) ||
         (bVar4 = str_cmp(ppVar7->name,profname), ppVar8 = ppVar7, bVar4)) {
        ppVar8 = ppVar3;
      }
    }
    else if (lVar5 == 2) {
LAB_00371151:
      if ((ppVar7->name == (char *)0x0) ||
         (bVar4 = str_cmp(ppVar7->name,profname), ppVar8 = ppVar7, bVar4)) {
        ppVar7 = ppVar7 + 1;
        goto LAB_00371173;
      }
    }
    else {
      ppVar8 = ppVar3;
      if ((lVar5 == 3) &&
         ((ppVar7->name == (char *)0x0 ||
          (bVar4 = str_cmp(ppVar7->name,profname), ppVar8 = ppVar7, bVar4)))) {
        ppVar7 = ppVar7 + 1;
        goto LAB_00371151;
      }
    }
LAB_003711a9:
    if (ppVar8 != prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __return_storage_ptr__->flags = ppVar8->flags;
      uVar9 = *(undefined4 *)&ppVar8->ppsn;
      uVar10 = *(undefined4 *)((long)&ppVar8->ppsn + 4);
      uVar11 = *(undefined4 *)&ppVar8->name;
      uVar12 = *(undefined4 *)((long)&ppVar8->name + 4);
      iVar2 = ppVar8->minlevel;
      pcVar1 = ppVar8->requires;
      __return_storage_ptr__->cost = ppVar8->cost;
      __return_storage_ptr__->minlevel = iVar2;
      __return_storage_ptr__->requires = pcVar1;
      goto LAB_003711e3;
    }
  }
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->cost = 0;
  __return_storage_ptr__->minlevel = 0;
  __return_storage_ptr__->requires = (char *)0x0;
  uVar9 = 0x4f44fa;
  uVar10 = 0;
  uVar11 = 0x39ed74;
  uVar12 = 0;
LAB_003711e3:
  *(undefined4 *)&__return_storage_ptr__->ppsn = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->ppsn + 4) = uVar10;
  *(undefined4 *)&__return_storage_ptr__->name = uVar11;
  *(undefined4 *)((long)&__return_storage_ptr__->name + 4) = uVar12;
  return __return_storage_ptr__;
}

Assistant:

proficiency_type CProficiencies::GetProficiency(char* profname)
{
	proficiency_type result = { &psn_none, "", 0, 0, nullptr, PFLAGS_NONE };
	if(profname == nullptr)
		return result;

	auto it = std::find_if(prof_table.begin(), prof_table.end(), [profname] (auto prof) {
		return prof.name != nullptr && !str_cmp(prof.name, profname);
	});

	if (it == prof_table.end())
		return result;
	
	auto idx = it - prof_table.begin();
	return prof_table[idx];
}